

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  char *__s;
  ulong uVar5;
  CharFormat CVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *s_1;
  char cVar11;
  bool bVar12;
  bool bVar13;
  
  CVar6 = PrintCharsAsStringTo<char>((s->_M_dataplus)._M_p,s->_M_string_length,os);
  if ((CVar6 != kAsIs) && (FLAGS_gtest_print_utf8 == '\x01')) {
    __s = (s->_M_dataplus)._M_p;
    uVar5 = s->_M_string_length;
    bVar12 = uVar5 != 0;
    if (bVar12) {
      uVar10 = 1;
      do {
        bVar3 = __s[uVar10 - 1];
        iVar7 = iscntrl((uint)bVar3);
        if ((iVar7 != 0) && ((0xd < bVar3 || ((0x2600U >> (bVar3 & 0x1f) & 1) == 0)))) break;
        bVar12 = uVar10 < uVar5;
        bVar13 = uVar10 != uVar5;
        uVar10 = uVar10 + 1;
      } while (bVar13);
    }
    if (!bVar12) {
      bVar12 = uVar5 == 0;
      if (!bVar12) {
        uVar10 = 0;
        do {
          uVar1 = uVar10 + 1;
          bVar3 = __s[uVar10];
          cVar11 = '\x03';
          uVar9 = uVar1;
          if ((char)bVar3 < '\0') {
            if (bVar3 < 0xc2) goto LAB_00146266;
            if (((0xdf < bVar3) || (uVar5 < uVar10 + 2)) ||
               (cVar11 = '\0', uVar9 = uVar10 + 2, -0x41 < __s[uVar1])) {
              if ((((bVar3 & 0xf0) == 0xe0) && (uVar9 = uVar10 + 3, uVar9 <= uVar5)) &&
                 ((bVar4 = __s[uVar1], (char)bVar4 < -0x40 && (__s[uVar10 + 2] < -0x40)))) {
                cVar11 = '\0';
                if (bVar3 == 0xed) {
                  if (0x9f < bVar4) goto LAB_00146202;
                }
                else if ((bVar3 == 0xe0) && (bVar4 < 0xa0)) goto LAB_00146202;
              }
              else {
LAB_00146202:
                if (((byte)(bVar3 + 0x10) < 5) &&
                   ((((uVar2 = uVar10 + 4, uVar2 <= uVar5 &&
                      (bVar4 = __s[uVar1], (char)bVar4 < -0x40)) && (__s[uVar10 + 2] < -0x40)) &&
                    (__s[uVar10 + 3] < -0x40)))) {
                  uVar9 = uVar2;
                  if (bVar3 == 0xf4) {
                    cVar11 = 0x8f < bVar4;
                    uVar9 = uVar1;
                    if (!(bool)cVar11) {
                      uVar9 = uVar2;
                    }
                  }
                  else {
                    cVar11 = '\0';
                    if ((bVar3 == 0xf0) && (bVar4 < 0x90)) goto LAB_00146266;
                  }
                }
                else {
LAB_00146266:
                  cVar11 = '\x01';
                  uVar9 = uVar1;
                }
              }
            }
          }
        } while (((cVar11 == '\x03') || (cVar11 == '\0')) &&
                (bVar12 = uVar9 >= uVar5, uVar10 = uVar9, uVar9 < uVar5));
      }
      if (bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n    As Text: \"",0xf);
        if (__s == (char *)0x0) {
          std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        return;
      }
    }
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG_GET(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}